

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::XFileImporter::CreateAnimations(XFileImporter *this,aiScene *pScene,Scene *pData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  aiQuaternion *paVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  double dVar10;
  pointer ppAVar11;
  Animation *pAVar12;
  undefined8 *puVar13;
  undefined1 auVar14 [16];
  aiVectorKey *paVar15;
  uint uVar16;
  uint uVar17;
  aiAnimation *paVar18;
  aiNodeAnim **ppaVar19;
  aiNodeAnim *paVar20;
  aiVectorKey *paVar21;
  aiQuatKey *paVar22;
  long lVar23;
  aiAnimation **ppaVar24;
  uint c;
  long lVar25;
  int iVar26;
  aiQuatKey *paVar27;
  pointer ppaVar28;
  double *pdVar29;
  ulong uVar30;
  uint c_1;
  ulong uVar31;
  pointer ppaVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined1 auVar35 [16];
  float fVar36;
  float fVar38;
  undefined1 auVar37 [16];
  float fVar39;
  float fVar42;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar43;
  float fVar44;
  aiAnimation *nanim;
  ulong local_b8;
  Scene *local_b0;
  Animation *local_a8;
  aiVectorKey **local_a0;
  vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> newAnims;
  aiQuaterniont<float> local_68;
  aiVector3D pos;
  float fStack_4c;
  
  newAnims.super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newAnims.super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  newAnims.super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar17 = 0;
  local_b0 = pData;
  do {
    ppaVar32 = newAnims.super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ppaVar28 = newAnims.super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppAVar11 = (local_b0->mAnims).
               super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_b0->mAnims).
                      super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar11 >> 3) <=
        (ulong)uVar17) {
      uVar30 = (long)newAnims.super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)newAnims.super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (uVar30 != 0) {
        pScene->mNumAnimations = (uint)(uVar30 >> 3);
        ppaVar24 = (aiAnimation **)operator_new__(uVar30 & 0x7fffffff8);
        pScene->mAnimations = ppaVar24;
        for (uVar17 = 0; uVar30 = (ulong)uVar17,
            uVar30 < (ulong)((long)ppaVar32 - (long)ppaVar28 >> 3); uVar17 = uVar17 + 1) {
          pScene->mAnimations[uVar30] = ppaVar28[uVar30];
          ppaVar28 = newAnims.super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppaVar32 = newAnims.super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      std::_Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>::~_Vector_base
                (&newAnims.super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>);
      return;
    }
    pAVar12 = ppAVar11[uVar17];
    if ((pAVar12->mAnims).
        super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&(pAVar12->mAnims).
                 super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                 ._M_impl + 8)) {
      paVar18 = (aiAnimation *)operator_new(0x448);
      aiAnimation::aiAnimation(paVar18);
      nanim = paVar18;
      std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::push_back(&newAnims,&nanim);
      paVar18 = nanim;
      uVar30 = (pAVar12->mName)._M_string_length;
      if (uVar30 < 0x400) {
        (nanim->mName).length = (ai_uint32)uVar30;
        memcpy((nanim->mName).data,(pAVar12->mName)._M_dataplus._M_p,uVar30);
        (paVar18->mName).data[uVar30] = '\0';
      }
      paVar18 = nanim;
      nanim->mDuration = 0.0;
      nanim->mTicksPerSecond = (double)local_b0->mAnimTicksPerSecond;
      uVar30 = (long)*(pointer *)
                      ((long)&(pAVar12->mAnims).
                              super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                              ._M_impl + 8) -
               *(long *)&(pAVar12->mAnims).
                         super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                         ._M_impl.super__Vector_impl_data;
      nanim->mNumChannels = (uint)(uVar30 >> 3);
      ppaVar19 = (aiNodeAnim **)operator_new__(uVar30 & 0x7fffffff8);
      paVar18->mChannels = ppaVar19;
      uVar16 = 0;
      local_a8 = pAVar12;
      while( true ) {
        uVar30 = (ulong)uVar16;
        lVar25 = *(long *)&(local_a8->mAnims).
                           super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                           ._M_impl.super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&(local_a8->mAnims).
                                   super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                                   ._M_impl + 8) - lVar25 >> 3) <= uVar30) break;
        puVar13 = *(undefined8 **)(lVar25 + uVar30 * 8);
        local_b8 = uVar30;
        paVar20 = (aiNodeAnim *)operator_new(0x438);
        (paVar20->mNodeName).length = 0;
        (paVar20->mNodeName).data[0] = '\0';
        memset((paVar20->mNodeName).data + 1,0x1b,0x3ff);
        paVar20->mRotationKeys = (aiQuatKey *)0x0;
        paVar20->mNumScalingKeys = 0;
        *(undefined8 *)&paVar20->mNumPositionKeys = 0;
        *(undefined8 *)((long)&paVar20->mPositionKeys + 4) = 0;
        paVar20->mScalingKeys = (aiVectorKey *)0x0;
        paVar20->mPreState = aiAnimBehaviour_DEFAULT;
        paVar20->mPostState = aiAnimBehaviour_DEFAULT;
        uVar30 = puVar13[1];
        if (uVar30 < 0x400) {
          (paVar20->mNodeName).length = (ai_uint32)uVar30;
          memcpy((paVar20->mNodeName).data,(void *)*puVar13,uVar30);
          (paVar20->mNodeName).data[uVar30] = '\0';
        }
        local_a0 = &paVar20->mScalingKeys;
        nanim->mChannels[local_b8] = paVar20;
        if (puVar13[0xd] == puVar13[0xe]) {
          uVar30 = (long)(puVar13[5] - puVar13[4]) / 0x18;
          paVar20->mNumPositionKeys = (uint)uVar30;
          uVar31 = (uVar30 & 0xffffffff) * 0x18;
          paVar21 = (aiVectorKey *)operator_new__(uVar31);
          if ((uVar30 & 0xffffffff) != 0) {
            lVar25 = 0;
            do {
              *(undefined4 *)((long)&(paVar21->mValue).z + lVar25) = 0;
              puVar1 = (undefined8 *)((long)&paVar21->mTime + lVar25);
              *puVar1 = 0;
              puVar1[1] = 0;
              lVar25 = lVar25 + 0x18;
            } while (uVar31 - lVar25 != 0);
          }
          paVar20->mPositionKeys = paVar21;
          lVar25 = 0;
          for (uVar31 = 0; uVar31 < (uVar30 & 0xffffffff); uVar31 = uVar31 + 1) {
            lVar23 = puVar13[4];
            fVar4 = *(float *)(lVar23 + 0x10 + lVar25);
            pos.z = fVar4;
            uVar7 = *(undefined8 *)(lVar23 + 8 + lVar25);
            pos.x = (float)(int)uVar7;
            pos.y = (float)(int)((ulong)uVar7 >> 0x20);
            *(undefined8 *)((long)&paVar20->mPositionKeys->mTime + lVar25) =
                 *(undefined8 *)(lVar23 + lVar25);
            paVar21 = paVar20->mPositionKeys;
            *(float *)((long)&(paVar21->mValue).z + lVar25) = fVar4;
            *(undefined8 *)((long)&(paVar21->mValue).x + lVar25) = uVar7;
            uVar30 = (ulong)paVar20->mNumPositionKeys;
            lVar25 = lVar25 + 0x18;
          }
          uVar30 = (long)(puVar13[8] - puVar13[7]) / 0x18;
          paVar20->mNumRotationKeys = (uint)uVar30;
          uVar31 = uVar30 & 0xffffffff;
          paVar22 = (aiQuatKey *)operator_new__(uVar31 * 0x18);
          if (uVar31 != 0) {
            paVar27 = paVar22;
            do {
              paVar27->mTime = 0.0;
              (paVar27->mValue).w = 1.0;
              (paVar27->mValue).x = 0.0;
              (paVar27->mValue).y = 0.0;
              (paVar27->mValue).z = 0.0;
              paVar27 = paVar27 + 1;
            } while (paVar27 != paVar22 + uVar31);
          }
          paVar20->mRotationKeys = paVar22;
          lVar25 = 8;
          for (uVar31 = 0; uVar31 < (uVar30 & 0xffffffff); uVar31 = uVar31 + 1) {
            aiQuaterniont<float>::GetMatrix
                      ((aiMatrix3x3t<float> *)&pos,(aiQuaterniont<float> *)(puVar13[7] + lVar25));
            *(undefined8 *)((long)paVar20->mRotationKeys + lVar25 + -8) =
                 *(undefined8 *)(puVar13[7] + -8 + lVar25);
            aiQuaterniont<float>::aiQuaterniont(&local_68,(aiMatrix3x3t<float> *)&pos);
            puVar1 = (undefined8 *)((long)&paVar20->mRotationKeys->mTime + lVar25);
            *puVar1 = local_68._0_8_;
            puVar1[1] = local_68._8_8_;
            *(uint *)((long)&paVar20->mRotationKeys->mTime + lVar25) =
                 *(uint *)((long)&paVar20->mRotationKeys->mTime + lVar25) ^ 0x80000000;
            uVar30 = (ulong)paVar20->mNumRotationKeys;
            lVar25 = lVar25 + 0x18;
          }
          uVar30 = (long)(puVar13[0xb] - puVar13[10]) / 0x18;
          paVar20->mNumScalingKeys = (uint)uVar30;
          uVar31 = (uVar30 & 0xffffffff) * 0x18;
          paVar21 = (aiVectorKey *)operator_new__(uVar31);
          if ((uVar30 & 0xffffffff) != 0) {
            lVar25 = 0;
            do {
              *(undefined4 *)((long)&(paVar21->mValue).z + lVar25) = 0;
              puVar1 = (undefined8 *)((long)&paVar21->mTime + lVar25);
              *puVar1 = 0;
              puVar1[1] = 0;
              lVar25 = lVar25 + 0x18;
            } while (uVar31 - lVar25 != 0);
          }
          *local_a0 = paVar21;
          lVar25 = 0;
          for (uVar31 = 0; uVar31 < (uVar30 & 0xffffffff); uVar31 = uVar31 + 1) {
            lVar23 = puVar13[10];
            paVar21 = paVar20->mScalingKeys;
            *(undefined4 *)((long)&(paVar21->mValue).z + lVar25) =
                 *(undefined4 *)(lVar23 + 0x10 + lVar25);
            puVar1 = (undefined8 *)(lVar23 + lVar25);
            uVar7 = puVar1[1];
            puVar2 = (undefined8 *)((long)&paVar21->mTime + lVar25);
            *puVar2 = *puVar1;
            puVar2[1] = uVar7;
            uVar30 = (ulong)paVar20->mNumScalingKeys;
            lVar25 = lVar25 + 0x18;
          }
          if (puVar13[5] != puVar13[4]) {
            dVar6 = *(double *)(puVar13[5] + -0x18);
            uVar33 = SUB84(dVar6,0);
            uVar34 = (undefined4)((ulong)dVar6 >> 0x20);
            dVar10 = nanim->mDuration;
            if (dVar6 <= dVar10) {
              uVar33 = SUB84(dVar10,0);
              uVar34 = (undefined4)((ulong)dVar10 >> 0x20);
            }
            nanim->mDuration = (double)CONCAT44(uVar34,uVar33);
          }
          iVar26 = (int)local_b8;
          if (puVar13[8] != puVar13[7]) {
            dVar6 = *(double *)(puVar13[8] + -0x18);
            uVar33 = SUB84(dVar6,0);
            uVar34 = (undefined4)((ulong)dVar6 >> 0x20);
            dVar10 = nanim->mDuration;
            if (dVar6 <= dVar10) {
              uVar33 = SUB84(dVar10,0);
              uVar34 = (undefined4)((ulong)dVar10 >> 0x20);
            }
            nanim->mDuration = (double)CONCAT44(uVar34,uVar33);
          }
          if (puVar13[0xb] != puVar13[10]) {
            pdVar29 = (double *)(puVar13[0xb] + -0x18);
            goto LAB_00524d42;
          }
        }
        else {
          uVar30 = (long)(puVar13[0xe] - puVar13[0xd]) / 0x48;
          paVar20->mNumPositionKeys = (uint)uVar30;
          uVar30 = uVar30 & 0xffffffff;
          uVar31 = uVar30 * 0x18;
          paVar21 = (aiVectorKey *)operator_new__(uVar31);
          if (uVar30 != 0) {
            lVar25 = 0;
            do {
              *(undefined4 *)((long)&(paVar21->mValue).z + lVar25) = 0;
              puVar1 = (undefined8 *)((long)&paVar21->mTime + lVar25);
              *puVar1 = 0;
              puVar1[1] = 0;
              lVar25 = lVar25 + 0x18;
            } while (uVar31 - lVar25 != 0);
          }
          paVar20->mPositionKeys = paVar21;
          uVar30 = (long)(puVar13[0xe] - puVar13[0xd]) / 0x48;
          paVar20->mNumRotationKeys = (uint)uVar30;
          uVar30 = uVar30 & 0xffffffff;
          paVar22 = (aiQuatKey *)operator_new__(uVar30 * 0x18);
          if (uVar30 != 0) {
            paVar27 = paVar22;
            do {
              paVar27->mTime = 0.0;
              (paVar27->mValue).w = 1.0;
              (paVar27->mValue).x = 0.0;
              (paVar27->mValue).y = 0.0;
              (paVar27->mValue).z = 0.0;
              paVar27 = paVar27 + 1;
            } while (paVar27 != paVar22 + uVar30);
          }
          paVar20->mRotationKeys = paVar22;
          uVar30 = (long)(puVar13[0xe] - puVar13[0xd]) / 0x48;
          paVar20->mNumScalingKeys = (uint)uVar30;
          uVar30 = uVar30 & 0xffffffff;
          uVar31 = uVar30 * 0x18;
          paVar21 = (aiVectorKey *)operator_new__(uVar31);
          if (uVar30 != 0) {
            lVar25 = 0;
            do {
              *(undefined4 *)((long)&(paVar21->mValue).z + lVar25) = 0;
              puVar1 = (undefined8 *)((long)&paVar21->mTime + lVar25);
              *puVar1 = 0;
              puVar1[1] = 0;
              lVar25 = lVar25 + 0x18;
            } while (uVar31 - lVar25 != 0);
          }
          *local_a0 = paVar21;
          uVar16 = 0;
          while( true ) {
            uVar30 = (ulong)uVar16;
            lVar25 = puVar13[0xd];
            if ((ulong)((puVar13[0xe] - lVar25) / 0x48) <= uVar30) break;
            lVar23 = uVar30 * 0x48;
            dVar6 = *(double *)(lVar25 + lVar23);
            fVar4 = *(float *)(lVar25 + 0x10 + lVar23);
            fVar38 = *(float *)(lVar25 + 0x14 + lVar23);
            fVar5 = *(float *)(lVar25 + 0x20 + lVar23);
            fVar39 = *(float *)(lVar25 + 0x24 + lVar23);
            fVar36 = *(float *)(lVar25 + 0x30 + lVar23);
            fVar42 = *(float *)(lVar25 + 0x34 + lVar23);
            fVar36 = SQRT(fVar36 * fVar36 + fVar4 * fVar4 + fVar5 * fVar5);
            uVar7 = *(undefined8 *)(lVar25 + 8 + lVar23);
            uVar8 = *(undefined8 *)(lVar25 + 0x18 + lVar23);
            uVar9 = *(undefined8 *)(lVar25 + 0x28 + lVar23);
            paVar20->mPositionKeys[uVar30].mTime = dVar6;
            paVar21 = paVar20->mPositionKeys;
            paVar21[uVar30].mValue.x = fVar38;
            paVar21[uVar30].mValue.y = fVar39;
            paVar21[uVar30].mValue.z = fVar42;
            fVar43 = (float)uVar8;
            fVar44 = (float)((ulong)uVar8 >> 0x20);
            fVar38 = (float)((ulong)uVar7 >> 0x20);
            fVar39 = (float)uVar9;
            fVar42 = (float)((ulong)uVar9 >> 0x20);
            auVar35._4_4_ = fVar5;
            auVar35._0_4_ = fVar44;
            auVar35._8_4_ = fVar39;
            auVar35._12_4_ = fVar42;
            auVar40._0_4_ = fVar39 * fVar39 + (float)uVar7 * (float)uVar7 + fVar43 * fVar43;
            auVar40._4_4_ = fVar42 * fVar42 + fVar38 * fVar38 + fVar44 * fVar44;
            auVar40._8_8_ = 0;
            auVar40 = sqrtps(auVar40,auVar40);
            paVar20->mScalingKeys[uVar30].mTime = dVar6;
            paVar21 = paVar20->mScalingKeys;
            paVar15 = paVar21 + uVar30;
            auVar41._0_8_ = auVar40._0_8_;
            (paVar15->mValue).x = (float)(int)auVar41._0_8_;
            (paVar15->mValue).y = (float)(int)((ulong)auVar41._0_8_ >> 0x20);
            paVar21[uVar30].mValue.z = fVar36;
            auVar37._8_4_ = fVar4;
            auVar37._0_8_ = uVar7;
            auVar37._12_4_ = fVar43;
            auVar41._8_4_ = fVar36;
            auVar41._12_4_ = auVar40._0_4_;
            _pos = divps(auVar37,auVar41);
            auVar14._4_4_ = fVar36;
            auVar14._0_4_ = auVar40._4_4_;
            auVar14._8_4_ = auVar40._0_4_;
            auVar14._12_4_ = auVar40._4_4_;
            divps(auVar35,auVar14);
            paVar20->mRotationKeys[uVar30].mTime = dVar6;
            aiQuaterniont<float>::aiQuaterniont(&local_68,(aiMatrix3x3t<float> *)&pos);
            paVar3 = &paVar20->mRotationKeys[uVar30].mValue;
            paVar3->w = local_68.w;
            paVar3->x = local_68.x;
            paVar3->y = local_68.y;
            paVar3->z = local_68.z;
            uVar16 = uVar16 + 1;
          }
          pdVar29 = (double *)(puVar13[0xe] + -0x48);
          iVar26 = (int)local_b8;
LAB_00524d42:
          dVar6 = *pdVar29;
          uVar33 = SUB84(dVar6,0);
          uVar34 = (undefined4)((ulong)dVar6 >> 0x20);
          dVar10 = nanim->mDuration;
          if (dVar6 <= dVar10) {
            uVar33 = SUB84(dVar10,0);
            uVar34 = (undefined4)((ulong)dVar10 >> 0x20);
          }
          nanim->mDuration = (double)CONCAT44(uVar34,uVar33);
        }
        uVar16 = iVar26 + 1;
      }
    }
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void XFileImporter::CreateAnimations( aiScene* pScene, const XFile::Scene* pData) {
    std::vector<aiAnimation*> newAnims;

    for( unsigned int a = 0; a < pData->mAnims.size(); ++a ) {
        const XFile::Animation* anim = pData->mAnims[a];
        // some exporters mock me with empty animation tags.
        if ( anim->mAnims.empty() ) {
            continue;
        }

        // create a new animation to hold the data
        aiAnimation* nanim = new aiAnimation;
        newAnims.push_back( nanim);
        nanim->mName.Set( anim->mName);
        // duration will be determined by the maximum length
        nanim->mDuration = 0;
        nanim->mTicksPerSecond = pData->mAnimTicksPerSecond;
        nanim->mNumChannels = (unsigned int)anim->mAnims.size();
        nanim->mChannels = new aiNodeAnim*[nanim->mNumChannels];

        for( unsigned int b = 0; b < anim->mAnims.size(); ++b ) {
            const XFile::AnimBone* bone = anim->mAnims[b];
            aiNodeAnim* nbone = new aiNodeAnim;
            nbone->mNodeName.Set( bone->mBoneName);
            nanim->mChannels[b] = nbone;

            // key-frames are given as combined transformation matrix keys
            if( !bone->mTrafoKeys.empty() )
            {
                nbone->mNumPositionKeys = (unsigned int)bone->mTrafoKeys.size();
                nbone->mPositionKeys = new aiVectorKey[nbone->mNumPositionKeys];
                nbone->mNumRotationKeys = (unsigned int)bone->mTrafoKeys.size();
                nbone->mRotationKeys = new aiQuatKey[nbone->mNumRotationKeys];
                nbone->mNumScalingKeys = (unsigned int)bone->mTrafoKeys.size();
                nbone->mScalingKeys = new aiVectorKey[nbone->mNumScalingKeys];

                for( unsigned int c = 0; c < bone->mTrafoKeys.size(); ++c)  {
                    // deconstruct each matrix into separate position, rotation and scaling
                    double time = bone->mTrafoKeys[c].mTime;
                    aiMatrix4x4 trafo = bone->mTrafoKeys[c].mMatrix;

                    // extract position
                    aiVector3D pos( trafo.a4, trafo.b4, trafo.c4);

                    nbone->mPositionKeys[c].mTime = time;
                    nbone->mPositionKeys[c].mValue = pos;

                    // extract scaling
                    aiVector3D scale;
                    scale.x = aiVector3D( trafo.a1, trafo.b1, trafo.c1).Length();
                    scale.y = aiVector3D( trafo.a2, trafo.b2, trafo.c2).Length();
                    scale.z = aiVector3D( trafo.a3, trafo.b3, trafo.c3).Length();
                    nbone->mScalingKeys[c].mTime = time;
                    nbone->mScalingKeys[c].mValue = scale;

                    // reconstruct rotation matrix without scaling
                    aiMatrix3x3 rotmat(
                        trafo.a1 / scale.x, trafo.a2 / scale.y, trafo.a3 / scale.z,
                        trafo.b1 / scale.x, trafo.b2 / scale.y, trafo.b3 / scale.z,
                        trafo.c1 / scale.x, trafo.c2 / scale.y, trafo.c3 / scale.z);

                    // and convert it into a quaternion
                    nbone->mRotationKeys[c].mTime = time;
                    nbone->mRotationKeys[c].mValue = aiQuaternion( rotmat);
                }

                // longest lasting key sequence determines duration
                nanim->mDuration = std::max( nanim->mDuration, bone->mTrafoKeys.back().mTime);
            } else {
                // separate key sequences for position, rotation, scaling
                nbone->mNumPositionKeys = (unsigned int)bone->mPosKeys.size();
                nbone->mPositionKeys = new aiVectorKey[nbone->mNumPositionKeys];
                for( unsigned int c = 0; c < nbone->mNumPositionKeys; ++c ) {
                    aiVector3D pos = bone->mPosKeys[c].mValue;

                    nbone->mPositionKeys[c].mTime = bone->mPosKeys[c].mTime;
                    nbone->mPositionKeys[c].mValue = pos;
                }

                // rotation
                nbone->mNumRotationKeys = (unsigned int)bone->mRotKeys.size();
                nbone->mRotationKeys = new aiQuatKey[nbone->mNumRotationKeys];
                for( unsigned int c = 0; c < nbone->mNumRotationKeys; ++c ) {
                    aiMatrix3x3 rotmat = bone->mRotKeys[c].mValue.GetMatrix();

                    nbone->mRotationKeys[c].mTime = bone->mRotKeys[c].mTime;
                    nbone->mRotationKeys[c].mValue = aiQuaternion( rotmat);
                    nbone->mRotationKeys[c].mValue.w *= -1.0f; // needs quat inversion
                }

                // scaling
                nbone->mNumScalingKeys = (unsigned int)bone->mScaleKeys.size();
                nbone->mScalingKeys = new aiVectorKey[nbone->mNumScalingKeys];
                for( unsigned int c = 0; c < nbone->mNumScalingKeys; c++)
                    nbone->mScalingKeys[c] = bone->mScaleKeys[c];

                // longest lasting key sequence determines duration
                if( bone->mPosKeys.size() > 0)
                    nanim->mDuration = std::max( nanim->mDuration, bone->mPosKeys.back().mTime);
                if( bone->mRotKeys.size() > 0)
                    nanim->mDuration = std::max( nanim->mDuration, bone->mRotKeys.back().mTime);
                if( bone->mScaleKeys.size() > 0)
                    nanim->mDuration = std::max( nanim->mDuration, bone->mScaleKeys.back().mTime);
            }
        }
    }

    // store all converted animations in the scene
    if( newAnims.size() > 0)
    {
        pScene->mNumAnimations = (unsigned int)newAnims.size();
        pScene->mAnimations = new aiAnimation* [pScene->mNumAnimations];
        for( unsigned int a = 0; a < newAnims.size(); a++)
            pScene->mAnimations[a] = newAnims[a];
    }
}